

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

int __thiscall
testing::internal::UnitTestImpl::FilterTests(UnitTestImpl *this,ReactionToSharding shard_tests)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  String local_78;
  ulong local_68;
  undefined1 local_60 [8];
  String test_name;
  int local_38;
  int local_34;
  
  local_38 = -1;
  local_34 = -1;
  test_name.length_ = (size_t)this;
  if (shard_tests == HONOR_SHARDING_PROTOCOL) {
    local_34 = Int32FromEnvOrDie("GTEST_TOTAL_SHARDS",-1);
    local_38 = Int32FromEnvOrDie("GTEST_SHARD_INDEX",-1);
  }
  lVar4 = *(long *)(test_name.length_ + 0xa0);
  if (*(long *)(test_name.length_ + 0xa8) == lVar4) {
    iVar7 = 0;
  }
  else {
    iVar6 = 0;
    iVar7 = 0;
    local_68 = 0;
    do {
      lVar4 = *(long *)(lVar4 + local_68 * 8);
      String::String(&local_78,*(char **)(lVar4 + 8));
      *(undefined1 *)(lVar4 + 0x68) = 0;
      lVar5 = *(long *)(lVar4 + 0x28);
      if (*(long *)(lVar4 + 0x30) != lVar5) {
        uVar8 = 0;
        do {
          lVar5 = *(long *)(lVar5 + uVar8 * 8);
          String::String((String *)local_60,*(char **)(lVar5 + 0x20));
          bVar1 = UnitTestOptions::MatchesFilter(&local_78,"DISABLED_*:*/DISABLED_*");
          bVar2 = true;
          if (!bVar1) {
            bVar2 = UnitTestOptions::MatchesFilter((String *)local_60,"DISABLED_*:*/DISABLED_*");
          }
          *(bool *)(lVar5 + 0x89) = bVar2;
          bVar3 = UnitTestOptions::FilterMatchesTest(&local_78,(String *)local_60);
          *(bool *)(lVar5 + 0x8a) = bVar3;
          bVar3 = (bool)((bVar2 ^ 1U | FLAGS_gtest_also_run_disabled_tests) & bVar3);
          bVar1 = bVar3;
          if ((shard_tests != IGNORE_SHARDING_PROTOCOL) && (bVar3 != false)) {
            bVar1 = iVar6 % local_34 == local_38;
          }
          *(bool *)(lVar5 + 0x88) = bVar1;
          *(byte *)(lVar4 + 0x68) = *(byte *)(lVar4 + 0x68) | bVar1;
          if (local_60 != (undefined1  [8])0x0) {
            operator_delete__((void *)local_60);
          }
          iVar6 = iVar6 + (uint)bVar3;
          iVar7 = iVar7 + (uint)bVar1;
          uVar8 = uVar8 + 1;
          lVar5 = *(long *)(lVar4 + 0x28);
        } while (uVar8 < (ulong)(*(long *)(lVar4 + 0x30) - lVar5 >> 3));
      }
      if (local_78.c_str_ != (char *)0x0) {
        operator_delete__(local_78.c_str_);
      }
      local_68 = local_68 + 1;
      lVar4 = *(long *)(test_name.length_ + 0xa0);
    } while (local_68 < (ulong)(*(long *)(test_name.length_ + 0xa8) - lVar4 >> 3));
  }
  return iVar7;
}

Assistant:

int UnitTestImpl::FilterTests(ReactionToSharding shard_tests) {
  const Int32 total_shards = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestTotalShards, -1) : -1;
  const Int32 shard_index = shard_tests == HONOR_SHARDING_PROTOCOL ?
      Int32FromEnvOrDie(kTestShardIndex, -1) : -1;

  // num_runnable_tests are the number of tests that will
  // run across all shards (i.e., match filter and are not disabled).
  // num_selected_tests are the number of tests to be run on
  // this shard.
  int num_runnable_tests = 0;
  int num_selected_tests = 0;
  for (size_t i = 0; i < test_cases_.size(); i++) {
    TestCase* const test_case = test_cases_[i];
    const String &test_case_name = test_case->name();
    test_case->set_should_run(false);

    for (size_t j = 0; j < test_case->test_info_list().size(); j++) {
      TestInfo* const test_info = test_case->test_info_list()[j];
      const String test_name(test_info->name());
      // A test is disabled if test case name or test name matches
      // kDisableTestFilter.
      const bool is_disabled =
          internal::UnitTestOptions::MatchesFilter(test_case_name,
                                                   kDisableTestFilter) ||
          internal::UnitTestOptions::MatchesFilter(test_name,
                                                   kDisableTestFilter);
      test_info->is_disabled_ = is_disabled;

      const bool matches_filter =
          internal::UnitTestOptions::FilterMatchesTest(test_case_name,
                                                       test_name);
      test_info->matches_filter_ = matches_filter;

      const bool is_runnable =
          (GTEST_FLAG(also_run_disabled_tests) || !is_disabled) &&
          matches_filter;

      const bool is_selected = is_runnable &&
          (shard_tests == IGNORE_SHARDING_PROTOCOL ||
           ShouldRunTestOnShard(total_shards, shard_index,
                                num_runnable_tests));

      num_runnable_tests += is_runnable;
      num_selected_tests += is_selected;

      test_info->should_run_ = is_selected;
      test_case->set_should_run(test_case->should_run() || is_selected);
    }
  }
  return num_selected_tests;
}